

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloatImage.cpp
# Opt level: O1

Image * __thiscall nv::FloatImage::createImageGammaCorrect(FloatImage *this,float gamma)

{
  ushort uVar1;
  ushort uVar2;
  AutoPtr<nv::Image> AVar3;
  int iVar4;
  Image *this_00;
  anon_union_4_2_12391d8d_for_Color32_0 *paVar5;
  uint uVar6;
  uint uVar7;
  uint idx;
  ulong uVar8;
  int iVar9;
  int iVar10;
  float *pfVar11;
  float __y;
  AutoPtr<nv::Image> img;
  AutoPtr<nv::Image> local_48;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  
  if (this->m_componentNum != 4) {
    iVar4 = nvAbort("m_componentNum == 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvimage/FloatImage.cpp"
                    ,0x76,"Image *nv::FloatImage::createImageGammaCorrect(float) const");
    if (iVar4 == 1) {
      raise(5);
    }
  }
  this_00 = (Image *)operator_new(0x18);
  Image::Image(this_00);
  local_48.m_ptr = this_00;
  Image::allocate(this_00,(uint)this->m_width,(uint)this->m_height);
  uVar1 = this->m_width;
  uVar2 = this->m_height;
  uVar6 = (uint)uVar2 * (uint)uVar1;
  if (uVar6 != 0) {
    pfVar11 = this->m_mem;
    __y = 1.0 / gamma;
    uVar8 = (ulong)uVar6;
    idx = 0;
    do {
      local_34 = powf(*pfVar11,__y);
      local_38 = powf(pfVar11[(ulong)uVar2 * (ulong)uVar1],__y);
      local_3c = powf(pfVar11[uVar6 * 2],__y);
      local_40 = pfVar11[uVar6 * 3];
      paVar5 = &Image::pixel(local_48.m_ptr,idx)->field_0;
      iVar4 = (int)(local_40 * 255.0);
      if (iVar4 < 1) {
        iVar4 = 0;
      }
      if (0xfe < iVar4) {
        iVar4 = 0xff;
      }
      uVar7 = (uint)(local_3c * 255.0);
      if ((int)uVar7 < 1) {
        uVar7 = 0;
      }
      if (0xfe < (int)uVar7) {
        uVar7 = 0xff;
      }
      iVar9 = (int)(local_38 * 255.0);
      if (iVar9 < 1) {
        iVar9 = 0;
      }
      if (0xfe < iVar9) {
        iVar9 = 0xff;
      }
      iVar10 = (int)(local_34 * 255.0);
      if (iVar10 < 1) {
        iVar10 = 0;
      }
      if (0xfe < iVar10) {
        iVar10 = 0xff;
      }
      *paVar5 = (anon_union_4_2_12391d8d_for_Color32_0)
                (iVar9 << 8 | uVar7 | iVar10 << 0x10 | iVar4 << 0x18);
      idx = idx + 1;
      pfVar11 = pfVar11 + 1;
      uVar8 = uVar8 - 1;
    } while (uVar8 != 0);
  }
  AVar3.m_ptr = local_48.m_ptr;
  local_48.m_ptr = (Image *)0x0;
  AutoPtr<nv::Image>::~AutoPtr(&local_48);
  return AVar3.m_ptr;
}

Assistant:

Image * FloatImage::createImageGammaCorrect(float gamma/*= 2.2f*/) const
{
	nvCheck(m_componentNum == 4);
	
	AutoPtr<Image> img(new Image());
	img->allocate(m_width, m_height);
	
	const float * rChannel = this->channel(0);
	const float * gChannel = this->channel(1);
	const float * bChannel = this->channel(2);
	const float * aChannel = this->channel(3);

	const uint size = m_width * m_height;
	for(uint i = 0; i < size; i++)
	{
		const uint8 r = nv::clamp(int(255.0f * pow(rChannel[i], 1.0f/gamma)), 0, 255);
		const uint8 g = nv::clamp(int(255.0f * pow(gChannel[i], 1.0f/gamma)), 0, 255);
		const uint8 b = nv::clamp(int(255.0f * pow(bChannel[i], 1.0f/gamma)), 0, 255);
		const uint8 a = nv::clamp(int(255.0f * aChannel[i]), 0, 255);

		img->pixel(i) = Color32(r, g, b, a);
	}
	
	return img.release();
}